

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mldsa_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_7f38dd::MLDSATest_KeyGenTests87_Test::TestBody
          (MLDSATest_KeyGenTests87_Test *this)

{
  function<void_(FileTest_*)> local_28;
  
  local_28.super__Function_base._M_functor._8_8_ = 0;
  local_28.super__Function_base._M_functor._M_unused._M_object =
       MLDSAKeyGenTest<BCM_mldsa87_private_key,_2592UL,_&BCM_mldsa87_generate_key_external_entropy,_&BCM_mldsa87_marshal_private_key>
  ;
  local_28._M_invoker = std::_Function_handler<void_(FileTest_*),_void_(*)(FileTest_*)>::_M_invoke;
  local_28.super__Function_base._M_manager =
       std::_Function_handler<void_(FileTest_*),_void_(*)(FileTest_*)>::_M_manager;
  FileTestGTest("crypto/mldsa/mldsa_nist_keygen_87_tests.txt",&local_28);
  if (local_28.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_28.super__Function_base._M_manager)
              ((_Any_data *)&local_28,(_Any_data *)&local_28,__destroy_functor);
  }
  return;
}

Assistant:

TEST(MLDSATest, KeyGenTests87) {
  FileTestGTest(
      "crypto/mldsa/mldsa_nist_keygen_87_tests.txt",
      MLDSAKeyGenTest<BCM_mldsa87_private_key, BCM_MLDSA87_PUBLIC_KEY_BYTES,
                      BCM_mldsa87_generate_key_external_entropy,
                      BCM_mldsa87_marshal_private_key>);
}